

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O1

AggregateFunction * duckdb::ListFun::GetFunction(void)

{
  AggregateFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_59;
  LogicalType local_58;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_40;
  LogicalType local_28;
  
  LogicalType::LogicalType(&local_28,ANY);
  __l._M_len = 1;
  __l._M_array = &local_28;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_40,__l,&local_59);
  LogicalType::LogicalType(&local_58,LIST);
  AggregateFunction::AggregateFunction
            (in_RDI,(vector<duckdb::LogicalType,_true> *)&local_40,&local_58,
             AggregateFunction::StateSize<duckdb::ListAggState>,
             AggregateFunction::
             StateInitialize<duckdb::ListAggState,duckdb::ListFunction,(duckdb::AggregateDestructorType)0>
             ,ListUpdateFunction,ListCombineFunction,ListFinalize,(aggregate_simple_update_t)0x0,
             ListBindFunction,(aggregate_destructor_t)0x0,(aggregate_statistics_t)0x0,
             (aggregate_window_t)0x0,(aggregate_serialize_t)0x0,(aggregate_deserialize_t)0x0);
  LogicalType::~LogicalType(&local_58);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_40);
  LogicalType::~LogicalType(&local_28);
  return in_RDI;
}

Assistant:

AggregateFunction ListFun::GetFunction() {
	auto func =
	    AggregateFunction({LogicalType::ANY}, LogicalTypeId::LIST, AggregateFunction::StateSize<ListAggState>,
	                      AggregateFunction::StateInitialize<ListAggState, ListFunction>, ListUpdateFunction,
	                      ListCombineFunction, ListFinalize, nullptr, ListBindFunction, nullptr, nullptr, nullptr);

	return func;
}